

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompileType<short>(void)

{
  undefined1 uVar1;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar2;
  short result;
  short x;
  bool b2;
  short *p4;
  short *p3;
  short *r;
  short *p2;
  short *p1;
  longdouble ld;
  double d;
  float f;
  size_t size;
  wchar_t w;
  bool b;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> sb;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  short t;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> s;
  SafeInt *this;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_e;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c;
  short local_a [4];
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2;
  
  this = (SafeInt *)&local_2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  local_a[1] = 0;
  local_a[2] = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<Foo>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_ffffffffffffff86,
                           CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
               (Foo *)this);
  local_a[0] = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_c,local_a);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_e,false);
  CompiledMixedType<short,char>();
  CompiledMixedType<short,signed_char>();
  CompiledMixedType<short,unsigned_char>();
  CompiledMixedType<short,short>();
  CompiledMixedType<short,unsigned_short>();
  CompiledMixedType<short,int>();
  CompiledMixedType<short,unsigned_int>();
  CompiledMixedType<short,long>();
  CompiledMixedType<short,unsigned_long>();
  CompiledMixedType<short,long_long>();
  CompiledMixedType<short,unsigned_long_long>();
  ModulusFriendTest<short,char>();
  ModulusFriendTest<short,signed_char>();
  ModulusFriendTest<short,unsigned_char>();
  ModulusFriendTest<short,short>();
  ModulusFriendTest<short,unsigned_short>();
  ModulusFriendTest<short,int>();
  ModulusFriendTest<short,unsigned_int>();
  ModulusFriendTest<short,long>();
  ModulusFriendTest<short,unsigned_long>();
  ModulusFriendTest<short,long_long>();
  ModulusFriendTest<short,unsigned_long_long>();
  SafeInt::operator_cast_to_bool(this);
  SafeInt::operator_cast_to_wchar_t
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_float
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_double
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt::operator_cast_to_long_double
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::Ptr
            (&local_2);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::Ptr
            (&local_2);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::Ref
            (&local_2);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            (&local_2);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            (&local_2);
  uVar1 = SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          operator!(&local_c);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            (&local_c);
  local_a[0] = SafeInt::operator_cast_to_short
                         ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)CONCAT26(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                         );
  SVar2 = SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          operator++((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                CONCAT24(in_stack_ffffffffffffff8c,
                                                         CONCAT22(in_stack_ffffffffffffff8a,
                                                                  in_stack_ffffffffffffff88)))),
                     CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator++
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator--
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                        CONCAT24(SVar2.m_int,
                                                 CONCAT22(in_stack_ffffffffffffff8a,
                                                          in_stack_ffffffffffffff88)))),
             CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator--
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff86,
                         CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator~
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)this);
  local_a[0] = SafeInt::operator_cast_to_short
                         ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                           *)CONCAT26(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                         );
  SafeNegation<short>(1,(short *)this);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}